

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O3

vector<JSONNode,_std::allocator<JSONNode>_> * __thiscall
ser::MetainfoSet::GenerateNodes
          (vector<JSONNode,_std::allocator<JSONNode>_> *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *operand;
  size_t *psVar1;
  pointer pcVar2;
  int iVar3;
  undefined *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool *pbVar6;
  int *piVar7;
  float *pfVar8;
  double *pdVar9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  undefined4 extraout_var;
  size_t sVar12;
  SerializationException *this_00;
  char *pcVar13;
  _Rb_tree_header *p_Var14;
  SerializationException exception;
  ostringstream ss;
  json_string local_218;
  JSONNode local_1f8;
  undefined1 *local_1f0;
  undefined1 local_1e0 [16];
  undefined **local_1d0;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  json_string local_1a8 [11];
  
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<JSONNode,_std::allocator<JSONNode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<JSONNode,_std::allocator<JSONNode>_>::reserve
            (__return_storage_ptr__,(this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var10 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->data_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var14) {
    do {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,*(long *)(p_Var10 + 1),
                 (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
      puVar4 = &void::typeinfo;
      if (*(long **)(p_Var10 + 2) != (long *)0x0) {
        puVar4 = (undefined *)(**(code **)(**(long **)(p_Var10 + 2) + 0x10))();
      }
      operand = p_Var10 + 2;
      pcVar13 = *(char **)(puVar4 + 8);
      if (pcVar13 == _ofstream) {
LAB_001664be:
        pbVar6 = boost::any_cast<bool_const&>((any *)operand);
        JSONNode::JSONNode(&local_1f8,&local_218,*pbVar6);
      }
      else {
        if (*pcVar13 == '*') {
          if (pcVar13 != _put) {
            if (pcVar13 == _pthread_mutex_init) {
LAB_001664f1:
              pfVar8 = boost::any_cast<float_const&>((any *)operand);
              JSONNode::JSONNode(&local_1f8,&local_218,*pfVar8);
            }
            else if (pcVar13 == _typeinfo) {
LAB_0016650c:
              pdVar9 = boost::any_cast<double_const&>((any *)operand);
              JSONNode::JSONNode(&local_1f8,&local_218,*pdVar9);
            }
            else {
              if (pcVar13 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_00166584:
                local_1c8._M_p = (pointer)&local_1b8;
                local_1d0 = &PTR__SerializationException_00197708;
                local_1c0 = 0;
                local_1b8._M_local_buf[0] = '\0';
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Error: generation of node ",0x1a);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,local_218._M_dataplus._M_p,
                                     local_218._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," in anyNode (MetainfoSet.cpp file) is not possible",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," because the type ",0x12);
                if (*(placeholder **)operand == (placeholder *)0x0) {
                  puVar4 = &void::typeinfo;
                }
                else {
                  iVar3 = (*(*(placeholder **)operand)->_vptr_placeholder[2])();
                  puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
                }
                pcVar13 = *(char **)(puVar4 + 8) + (**(char **)(puVar4 + 8) == '*');
                sVar12 = strlen(pcVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," is not supported\n",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"This is a bug and should be notified\n",0x25);
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::_M_assign((string *)&local_1c8);
                if (local_1f0 != local_1e0) {
                  operator_delete(local_1f0);
                }
                this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
                SerializationException::SerializationException
                          (this_00,(SerializationException *)&local_1d0);
                __cxa_throw(this_00,&SerializationException::typeinfo,
                            SerializationException::~SerializationException);
              }
LAB_001663b7:
              pbVar5 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
              local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
              pcVar2 = (pbVar5->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a8,pcVar2,pcVar2 + pbVar5->_M_string_length);
              JSONNode::JSONNode(&local_1f8,&local_218,local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p);
              }
            }
            goto LAB_00166528;
          }
        }
        else {
          iVar3 = strcmp(pcVar13,_ofstream);
          if (iVar3 == 0) goto LAB_001664be;
          if ((pcVar13 != _put) && (iVar3 = strcmp(pcVar13,_put), iVar3 != 0)) {
            if ((pcVar13 != _pthread_mutex_init) &&
               (iVar3 = strcmp(pcVar13,_pthread_mutex_init), iVar3 != 0)) {
              if ((pcVar13 == _typeinfo) || (iVar3 = strcmp(pcVar13,_typeinfo), iVar3 == 0))
              goto LAB_0016650c;
              if ((pcVar13 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
                 (iVar3 = strcmp(pcVar13,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
                 iVar3 != 0)) goto LAB_00166584;
              goto LAB_001663b7;
            }
            goto LAB_001664f1;
          }
        }
        piVar7 = boost::any_cast<int_const&>((any *)operand);
        JSONNode::JSONNode(&local_1f8,&local_218,*piVar7);
      }
LAB_00166528:
      std::vector<JSONNode,_std::allocator<JSONNode>_>::emplace_back<JSONNode>
                (__return_storage_ptr__,&local_1f8);
      if (local_1f8.internal != (internalJSONNode *)0x0) {
        psVar1 = &(local_1f8.internal)->refcount;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          internalJSONNode::deleteInternal(local_1f8.internal);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var14);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< JSONNode> MetainfoSet::GenerateNodes() const
{
    std::vector< JSONNode> res;
    res.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        res.push_back(anyNode(iter->first, iter->second));
    }
    return res;
}